

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O0

void cfd::TransactionContextUtil::AddSign<cfd::ConfidentialTransactionContext>
               (ConfidentialTransactionContext *transaction,OutPoint *outpoint,
               vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_params,
               bool insert_witness,bool clear_stack)

{
  ByteData *pBVar1;
  bool bVar2;
  byte bVar3;
  undefined8 uVar4;
  ulong uVar5;
  reference this;
  byte in_CL;
  undefined8 in_RDX;
  ByteData *in_RDI;
  byte in_R8B;
  SignParameter *sign_param_2;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *__range3_3;
  ScriptElement *element;
  iterator __end3_2;
  iterator __begin3_2;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *__range3_2;
  ScriptBuilder builder;
  Script script;
  SignParameter *sign_param_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *__range3_1;
  uint32_t txin_index;
  uint32_t vout;
  Txid txid;
  ScriptOperator op_code;
  SignParameter *sign_param;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *__range3;
  bool has_op_code;
  AbstractTxInReference *in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb30;
  uint uVar6;
  undefined4 in_stack_fffffffffffffb34;
  undefined4 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  CfdError in_stack_fffffffffffffb4c;
  CfdException *in_stack_fffffffffffffb50;
  SignParameter *in_stack_fffffffffffffbe8;
  __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
  local_3e0;
  undefined8 local_3d8;
  reference local_3d0;
  ScriptElement *local_3c8;
  __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
  local_3c0;
  undefined1 local_3b8 [24];
  undefined1 *local_3a0;
  ScriptOperator local_398 [8];
  Script local_218;
  Script local_1e0;
  undefined1 local_190 [32];
  reference local_170;
  SignParameter *local_168;
  __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
  local_160;
  undefined8 local_158;
  uint local_150;
  undefined4 local_14c;
  undefined1 local_148 [80];
  reference local_f8;
  SignParameter *local_f0;
  __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
  local_e8;
  undefined8 local_e0;
  byte local_d3;
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [32];
  char *local_b0;
  undefined4 local_a8;
  char *local_a0;
  undefined1 local_92;
  allocator local_91;
  string local_90 [32];
  char *local_70;
  undefined4 local_68;
  char *local_60;
  undefined1 local_55;
  allocator local_41;
  string local_40 [38];
  byte local_1a;
  byte local_19;
  undefined8 local_18;
  ByteData *local_8;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  if (in_RDI == (ByteData *)0x0) {
    local_55 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Empty transaction.",&local_41);
    core::CfdException::CfdException
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
               (string *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    local_55 = 0;
    __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_18 = in_RDX;
  local_8 = in_RDI;
  bVar2 = std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::empty
                    ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                     CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  if (bVar2) {
    local_70 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_transaction_internal.cpp"
                       ,0x2f);
    local_70 = local_70 + 1;
    local_68 = 0xfc;
    local_60 = "AddSign";
    core::logger::warn<>
              ((CfdSourceLocation *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               (char *)in_stack_fffffffffffffb28);
    local_92 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"Empty sign_params.",&local_91);
    core::CfdException::CfdException
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
               (string *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    local_92 = 0;
    __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  uVar5 = cfd::core::OutPoint::IsValid();
  if ((uVar5 & 1) == 0) {
    local_b0 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_transaction_internal.cpp"
                       ,0x2f);
    local_b0 = local_b0 + 1;
    local_a8 = 0x101;
    local_a0 = "AddSign";
    core::logger::warn<>
              ((CfdSourceLocation *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               (char *)in_stack_fffffffffffffb28);
    local_d2 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"Invalid outpoint.",&local_d1);
    core::CfdException::CfdException
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
               (string *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    local_d2 = 0;
    __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_d3 = 0;
  if ((local_19 & 1) == 0) {
    local_e0 = local_18;
    local_e8._M_current =
         (SignParameter *)
         std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::begin
                   ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                    in_stack_fffffffffffffb28);
    local_f0 = (SignParameter *)
               std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::end
                         ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                          in_stack_fffffffffffffb28);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                              (__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                               *)in_stack_fffffffffffffb28), bVar2) {
      local_f8 = __gnu_cxx::
                 __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                 ::operator*(&local_e8);
      bVar2 = SignParameter::IsOpCode(local_f8);
      if (bVar2) {
        SignParameter::GetOpCode((SignParameter *)in_stack_fffffffffffffb28);
        bVar3 = cfd::core::ScriptOperator::IsPushOperator();
        if ((bVar3 & 1) != 0) {
          local_d3 = 1;
        }
        core::ScriptOperator::~ScriptOperator((ScriptOperator *)0x3a55bd);
      }
      __gnu_cxx::
      __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
      ::operator++(&local_e8);
    }
  }
  cfd::core::OutPoint::GetTxid();
  local_14c = cfd::core::OutPoint::GetVout();
  local_150 = (**(code **)((local_8->data_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start + 0x10))(local_8,local_148,local_14c);
  if ((local_19 & 1) == 0) {
    cfd::core::Script::Script(&local_1e0);
    if ((local_1a & 1) == 0) {
      cfd::core::ConfidentialTransaction::GetTxIn((int)local_398 + 0x20);
      core::AbstractTxInReference::GetUnlockingScript(in_stack_fffffffffffffb28);
      cfd::core::Script::operator=(&local_1e0,&local_218);
      core::Script::~Script((Script *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30))
      ;
      core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)
                 CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
    }
    core::ScriptBuilder::ScriptBuilder((ScriptBuilder *)0x3a5887);
    cfd::core::Script::GetElementList();
    local_3a0 = local_3b8;
    local_3c0._M_current =
         (ScriptElement *)
         std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::begin
                   ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                    in_stack_fffffffffffffb28);
    local_3c8 = (ScriptElement *)
                std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                end((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                    in_stack_fffffffffffffb28);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                              (__normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
                               *)in_stack_fffffffffffffb28), bVar2) {
      local_3d0 = __gnu_cxx::
                  __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
                  ::operator*(&local_3c0);
      cfd::core::ScriptBuilder::AppendElement((ScriptElement *)local_398);
      __gnu_cxx::
      __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
      ::operator++(&local_3c0);
    }
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    local_3d8 = local_18;
    local_3e0._M_current =
         (SignParameter *)
         std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::begin
                   ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                    in_stack_fffffffffffffb28);
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::end
              ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
               in_stack_fffffffffffffb28);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                          *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                         (__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                          *)in_stack_fffffffffffffb28);
      if (!bVar2) break;
      this = __gnu_cxx::
             __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
             ::operator*(&local_3e0);
      if ((local_d3 & 1) == 0) {
LAB_003a5a7c:
        SignParameter::ConvertToSignature(in_stack_fffffffffffffbe8);
        cfd::core::ScriptBuilder::AppendData((ByteData *)local_398);
        core::ByteData::~ByteData((ByteData *)0x3a5ab7);
      }
      else {
        bVar2 = SignParameter::IsOpCode(this);
        in_stack_fffffffffffffb34 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffb34);
        if (!bVar2) goto LAB_003a5a7c;
        SignParameter::GetOpCode((SignParameter *)in_stack_fffffffffffffb28);
        cfd::core::ScriptBuilder::AppendOperator(local_398);
        core::ScriptOperator::~ScriptOperator((ScriptOperator *)0x3a5a51);
      }
      __gnu_cxx::
      __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
      ::operator++(&local_3e0);
    }
    uVar6 = local_150;
    cfd::core::ScriptBuilder::Build();
    cfd::core::ConfidentialTransaction::SetUnlockingScript((uint)local_8,(Script *)(ulong)uVar6);
    core::Script::~Script((Script *)CONCAT44(in_stack_fffffffffffffb34,uVar6));
    core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)0x3a5b49);
    core::Script::~Script((Script *)CONCAT44(in_stack_fffffffffffffb34,uVar6));
  }
  else {
    if ((local_1a & 1) != 0) {
      cfd::core::ConfidentialTransaction::RemoveScriptWitnessStackAll((uint)local_8);
    }
    local_158 = local_18;
    local_160._M_current =
         (SignParameter *)
         std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::begin
                   ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                    in_stack_fffffffffffffb28);
    local_168 = (SignParameter *)
                std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::end
                          ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                           in_stack_fffffffffffffb28);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                              (__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                               *)in_stack_fffffffffffffb28), bVar2) {
      local_170 = __gnu_cxx::
                  __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                  ::operator*(&local_160);
      pBVar1 = local_8;
      SignParameter::ConvertToSignature(in_stack_fffffffffffffbe8);
      cfd::core::ConfidentialTransaction::AddScriptWitnessStack((uint)local_190,pBVar1);
      core::ScriptWitness::~ScriptWitness((ScriptWitness *)0x3a5749);
      core::ByteData::~ByteData((ByteData *)0x3a5756);
      __gnu_cxx::
      __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
      ::operator++(&local_160);
    }
  }
  core::Txid::~Txid((Txid *)0x3a5b9f);
  return;
}

Assistant:

void TransactionContextUtil::AddSign(
    Tx* transaction, const OutPoint& outpoint,
    const std::vector<SignParameter>& sign_params, bool insert_witness,
    bool clear_stack) {
  if (transaction == nullptr) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Empty transaction.");
  }
  if (sign_params.empty()) {
    warn(CFD_LOG_SOURCE, "Failed to AddSign. Empty sign_params.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Empty sign_params.");
  }
  if (!outpoint.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to AddSign. Invalid outpoint.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid outpoint.");
  }

  bool has_op_code = false;
  if (!insert_witness) {
    for (const SignParameter& sign_param : sign_params) {
      if (sign_param.IsOpCode()) {
        ScriptOperator op_code = sign_param.GetOpCode();
        if (op_code.IsPushOperator()) {
          has_op_code = true;
        }
      }
    }
  }
  Txid txid = outpoint.GetTxid();
  uint32_t vout = outpoint.GetVout();
  uint32_t txin_index = transaction->GetTxInIndex(txid, vout);

  if (insert_witness) {
    if (clear_stack) {
      transaction->RemoveScriptWitnessStackAll(txin_index);
    }
    for (const SignParameter& sign_param : sign_params) {
      transaction->AddScriptWitnessStack(
          txin_index, sign_param.ConvertToSignature());
    }
  } else {
    Script script;
    if (!clear_stack) {
      script = transaction->GetTxIn(txin_index).GetUnlockingScript();
    }
    ScriptBuilder builder;
    for (const auto& element : script.GetElementList()) {
      builder.AppendElement(element);
    }
    for (const SignParameter& sign_param : sign_params) {
      if (has_op_code && sign_param.IsOpCode()) {
        // Checking push-operator is performed at the time of registration.
        builder.AppendOperator(sign_param.GetOpCode());
      } else {
        builder.AppendData(sign_param.ConvertToSignature());
      }
    }
    transaction->SetUnlockingScript(txin_index, builder.Build());
  }
}